

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::iterate(SparseTextureClampLookupColorTestCase *this)

{
  ostringstream *this_00;
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  ostream *poVar7;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  int *piVar8;
  int iVar9;
  pointer pFVar10;
  GLuint texture;
  FunctionToken funcToken;
  GLuint local_26c;
  int *local_268;
  Functions *local_260;
  string *local_258;
  pointer local_250;
  ostream *local_248;
  long *local_240;
  long local_238;
  long local_230 [2];
  long *local_220 [2];
  long local_210 [2];
  long *local_200 [2];
  long local_1f0 [2];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1e0;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_SparseTextureClampLookupResidencyTestCase).
                      super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                      super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->m_contextInfo
                     ,"GL_ARB_sparse_texture_clamp");
  if (bVar2) {
    iVar5 = (*((this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    local_260 = (Functions *)CONCAT44(extraout_var,iVar5);
    local_268 = (this->super_SparseTextureClampLookupResidencyTestCase).
                super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                super_SparseTextureCommitmentTestCase.mSupportedTargets.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
    if (local_268 !=
        (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
        super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.
        mSupportedTargets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_258 = (string *)
                  &(this->super_SparseTextureClampLookupResidencyTestCase).
                   super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                   super_SparseTextureCommitmentTestCase.field_0x90;
      local_248 = (ostream *)
                  &(this->super_SparseTextureClampLookupResidencyTestCase).
                   super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                   super_SparseTextureCommitmentTestCase.field_0x88;
      bVar4 = 1;
      do {
        for (piVar8 = (this->super_SparseTextureClampLookupResidencyTestCase).
                      super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                      super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            piVar8 != (this->super_SparseTextureClampLookupResidencyTestCase).
                      super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                      super_SparseTextureCommitmentTestCase.mSupportedInternalFormats.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish; piVar8 = piVar8 + 1) {
          cVar3 = (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                         super_SparseTexture2LookupTestCase.
                                         super_SparseTexture2CommitmentTestCase.
                                         super_SparseTextureCommitmentTestCase.super_TestCase.
                                         super_TestCase.super_TestNode + 0x30))
                            (this,*local_268,*piVar8);
          iVar5 = 7;
          if (cVar3 != '\0') {
            pFVar10 = (this->super_SparseTextureClampLookupResidencyTestCase).
                      super_SparseTexture2LookupTestCase.mFunctions.
                      super__Vector_base<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar5 = 8;
            if (pFVar10 !=
                (this->super_SparseTextureClampLookupResidencyTestCase).
                super_SparseTexture2LookupTestCase.mFunctions.
                super__Vector_base<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                local_220[0] = local_210;
                pcVar1 = (pFVar10->name)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_220,pcVar1,pcVar1 + (pFVar10->name)._M_string_length);
                local_200[0] = local_1f0;
                pcVar1 = (pFVar10->arguments)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_200,pcVar1,pcVar1 + (pFVar10->arguments)._M_string_length
                          );
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                _Rb_tree(&local_1e0,&(pFVar10->allowedTargets)._M_t);
                cVar3 = (**(code **)(*(long *)&(this->
                                               super_SparseTextureClampLookupResidencyTestCase).
                                               super_SparseTexture2LookupTestCase.
                                               super_SparseTexture2CommitmentTestCase.
                                               super_SparseTextureCommitmentTestCase.super_TestCase.
                                               super_TestCase.super_TestNode + 0x88))
                                  (this,*local_268,*piVar8,local_220);
                iVar5 = 10;
                if (cVar3 != '\0') {
                  local_250 = pFVar10;
                  lVar6 = std::__cxx11::string::find((char *)local_220,0x1af1b2e,0);
                  local_1b0._0_8_ = local_1a0;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,0x1b32ab9);
                  std::__cxx11::stringbuf::str(local_258);
                  if ((TestLog *)local_1b0._0_8_ != local_1a0) {
                    operator_delete((void *)local_1b0._0_8_,
                                    (ulong)((long)&(local_1a0[0].m_log)->flags + 1));
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_248,"Testing sparse texture lookup color functions for target: ",
                             0x3a);
                  poVar7 = (ostream *)std::ostream::operator<<(local_248,*local_268);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", format: ",10);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*piVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
                  (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                         super_SparseTexture2LookupTestCase.
                                         super_SparseTexture2CommitmentTestCase.
                                         super_SparseTextureCommitmentTestCase.super_TestCase.
                                         super_TestCase.super_TestNode + 0x40 +
                              (ulong)(lVar6 == -1) * 8))
                            (this,local_260,*local_268,*piVar8,&local_26c,3);
                  if (*piVar8 == 0x81a5) {
                    (**(code **)(*(long *)&(this->super_SparseTextureClampLookupResidencyTestCase).
                                           super_SparseTexture2LookupTestCase.
                                           super_SparseTexture2CommitmentTestCase.
                                           super_SparseTextureCommitmentTestCase.super_TestCase.
                                           super_TestCase.super_TestNode + 0x90))
                              (this,local_260,*local_268,&local_26c);
                  }
                  if ((this->super_SparseTextureClampLookupResidencyTestCase).
                      super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                      super_SparseTextureCommitmentTestCase.mState.levels < 1) {
                    iVar5 = 0;
                  }
                  else {
                    iVar5 = 0;
                    iVar9 = 0;
                    do {
                      if ((lVar6 == -1) ||
                         (cVar3 = (**(code **)(*(long *)&(this->
                                                  super_SparseTextureClampLookupResidencyTestCase).
                                                  super_SparseTexture2LookupTestCase.
                                                  super_SparseTexture2CommitmentTestCase.
                                                  super_SparseTextureCommitmentTestCase.
                                                  super_TestCase.super_TestCase.super_TestNode +
                                              0x60))(this,local_260,*local_268,*piVar8,&local_26c,
                                                     iVar9), cVar3 != '\0')) {
                        (**(code **)(*(long *)&(this->
                                               super_SparseTextureClampLookupResidencyTestCase).
                                               super_SparseTexture2LookupTestCase.
                                               super_SparseTexture2CommitmentTestCase.
                                               super_SparseTextureCommitmentTestCase.super_TestCase.
                                               super_TestCase.super_TestNode + 0x50))
                                  (this,local_260,*local_268,*piVar8,&local_26c,iVar9);
                        iVar5 = iVar9;
                      }
                      iVar9 = iVar9 + 1;
                    } while (iVar9 < (this->super_SparseTextureClampLookupResidencyTestCase).
                                     super_SparseTexture2LookupTestCase.
                                     super_SparseTexture2CommitmentTestCase.
                                     super_SparseTextureCommitmentTestCase.mState.levels);
                  }
                  pFVar10 = local_250;
                  if (-1 < iVar5) {
                    iVar9 = 1;
                    do {
                      if ((bVar4 & 1) == 0) {
                        bVar4 = 0;
                      }
                      else {
                        bVar4 = (**(code **)(*(long *)&(this->
                                                  super_SparseTextureClampLookupResidencyTestCase).
                                                  super_SparseTexture2LookupTestCase.
                                                  super_SparseTexture2CommitmentTestCase.
                                                  super_SparseTextureCommitmentTestCase.
                                                  super_TestCase.super_TestCase.super_TestNode +
                                            0x98))(this,local_260,*local_268,*piVar8,&local_26c,
                                                   iVar9 + -1,local_220);
                      }
                    } while ((bVar4 != 0) && (bVar2 = iVar9 <= iVar5, iVar9 = iVar9 + 1, bVar2));
                  }
                  gl4cts::Texture::Delete(local_260,&local_26c);
                  this_00 = (ostringstream *)(local_1b0 + 8);
                  iVar5 = 0;
                  if ((bVar4 & 1) == 0) {
                    local_1b0._0_8_ =
                         ((this->super_SparseTextureClampLookupResidencyTestCase).
                          super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                          super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_log;
                    std::__cxx11::ostringstream::ostringstream(this_00);
                    std::__cxx11::stringbuf::str();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,(char *)local_240,local_238);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Fail",4);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    if (local_240 != local_230) {
                      operator_delete(local_240,local_230[0] + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream(this_00);
                    std::ios_base::~ios_base(local_138);
                    iVar5 = 1;
                    tcu::TestContext::setTestResult
                              ((this->super_SparseTextureClampLookupResidencyTestCase).
                               super_SparseTexture2LookupTestCase.
                               super_SparseTexture2CommitmentTestCase.
                               super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.
                               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
                  }
                }
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                ~_Rb_tree(&local_1e0);
                if (local_200[0] != local_1f0) {
                  operator_delete(local_200[0],local_1f0[0] + 1);
                }
                if (local_220[0] != local_210) {
                  operator_delete(local_220[0],local_210[0] + 1);
                }
                if ((iVar5 != 10) && (iVar5 != 0)) goto LAB_00a759ae;
                pFVar10 = pFVar10 + 1;
              } while (pFVar10 !=
                       (this->super_SparseTextureClampLookupResidencyTestCase).
                       super_SparseTexture2LookupTestCase.mFunctions.
                       super__Vector_base<gl4cts::SparseTexture2LookupTestCase::FunctionToken,_std::allocator<gl4cts::SparseTexture2LookupTestCase::FunctionToken>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
              iVar5 = 8;
            }
LAB_00a759ae:
            if (iVar5 == 8) {
              iVar5 = 0;
            }
          }
          if ((iVar5 != 7) && (iVar5 != 0)) goto LAB_00a759d4;
        }
        iVar5 = 5;
LAB_00a759d4:
        if (iVar5 == 5) {
          iVar5 = 0;
        }
        if (iVar5 != 0) goto LAB_00a75a03;
        local_268 = local_268 + 1;
      } while (local_268 !=
               (this->super_SparseTextureClampLookupResidencyTestCase).
               super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
               super_SparseTextureCommitmentTestCase.mSupportedTargets.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish);
      iVar5 = 2;
LAB_00a75a03:
      if (iVar5 != 2) {
        return STOP;
      }
    }
    this_01 = (this->super_SparseTextureClampLookupResidencyTestCase).
              super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    this_01 = (this->super_SparseTextureClampLookupResidencyTestCase).
              super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseTextureClampLookupColorTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture_clamp"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	GLuint texture;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::vector<glw::GLint>::const_iterator formIter = mSupportedInternalFormats.begin();
			 formIter != mSupportedInternalFormats.end(); ++formIter)
		{
			const GLint& format = *formIter;

			if (!caseAllowed(target, format))
				continue;

			for (std::vector<FunctionToken>::const_iterator tokIter = mFunctions.begin(); tokIter != mFunctions.end();
				 ++tokIter)
			{
				// Check if target is allowed for current lookup function
				FunctionToken funcToken = *tokIter;
				if (!funcAllowed(target, format, funcToken))
					continue;

				bool isSparse = false;
				if (funcToken.name.find("sparse", 0) != std::string::npos)
					isSparse = true;

				mLog.str("");
				mLog << "Testing sparse texture lookup color functions for target: " << target << ", format: " << format
					 << " - ";

				if (isSparse)
					sparseAllocateTexture(gl, target, format, texture, 3);
				else
					allocateTexture(gl, target, format, texture, 3);

				if (format == GL_DEPTH_COMPONENT16)
					setupDepthMode(gl, target, texture);

				int l;
				int maxLevels = 0;
				for (l = 0; l < mState.levels; ++l)
				{
					if (!isSparse || commitTexturePage(gl, target, format, texture, l))
					{
						writeDataToTexture(gl, target, format, texture, l);
						maxLevels = l;
					}
				}

				for (l = 0; l <= maxLevels; ++l)
				{
					result = result && verifyLookupTextureData(gl, target, format, texture, l, funcToken);

					if (!result)
						break;
				}

				Texture::Delete(gl, texture);

				if (!result)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << mLog.str() << "Fail" << tcu::TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}